

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O1

string_view absl::lts_20250127::FindLongestCommonPrefix(string_view a,string_view b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  string_view sVar13;
  
  pcVar6 = b._M_str;
  uVar5 = b._M_len;
  pcVar7 = a._M_str;
  uVar8 = a._M_len;
  if (uVar5 < a._M_len) {
    uVar8 = uVar5;
  }
  if (uVar8 < 8) {
    uVar9 = 0;
    do {
      uVar5 = uVar9;
      if (uVar8 < uVar5 + 2) {
        if (uVar5 == uVar8) {
          sVar13._M_str = pcVar7;
          sVar13._M_len = uVar5;
          return sVar13;
        }
        sVar11._M_len = (pcVar7[uVar5] == pcVar6[uVar5]) + uVar5;
        sVar11._M_str = pcVar7;
        return sVar11;
      }
      uVar9 = uVar5 + 2;
    } while (*(short *)(pcVar7 + uVar5) == *(short *)(pcVar6 + uVar5));
    uVar5 = uVar5 + ((char)*(short *)(pcVar6 + uVar5) == (char)*(short *)(pcVar7 + uVar5));
  }
  else {
    uVar9 = 0;
    do {
      uVar1 = *(ulong *)(pcVar7 + uVar9);
      uVar2 = *(ulong *)(pcVar6 + uVar9);
      if (uVar1 == uVar2) {
        uVar9 = uVar9 + 8;
      }
      else {
        uVar5 = uVar2 ^ uVar1;
        uVar4 = 0x40;
        if (uVar5 != 0) {
          lVar3 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar4 = (uint)lVar3;
        }
        uVar5 = (uVar4 >> 3) + uVar9;
        uVar9 = uVar5;
      }
      if (uVar1 != uVar2) goto LAB_0013aeef;
    } while (uVar9 + 8 < uVar8);
    if (*(ulong *)(pcVar7 + (uVar8 - 8)) == *(ulong *)(pcVar6 + (uVar8 - 8))) {
      sVar12._M_str = pcVar7;
      sVar12._M_len = uVar8;
      return sVar12;
    }
    uVar5 = *(ulong *)(pcVar6 + (uVar8 - 8)) ^ *(ulong *)(pcVar7 + (uVar8 - 8));
    if (uVar5 == 0) {
      uVar4 = 0x40;
    }
    else {
      lVar3 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar4 = (uint)lVar3;
    }
    uVar5 = (ulong)(uVar4 >> 3) + (uVar8 - 8);
  }
LAB_0013aeef:
  sVar10._M_str = pcVar7;
  sVar10._M_len = uVar5;
  return sVar10;
}

Assistant:

absl::string_view FindLongestCommonPrefix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  const char* const pa = a.data();
  const char* const pb = b.data();
  absl::string_view::size_type count = (unsigned) 0;

  if (ABSL_PREDICT_FALSE(limit < 8)) {
    while (ABSL_PREDICT_TRUE(count + 2 <= limit)) {
      uint16_t xor_bytes = absl::little_endian::Load16(pa + count) ^
                           absl::little_endian::Load16(pb + count);
      if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
        if (ABSL_PREDICT_TRUE((xor_bytes & 0xff) == 0)) ++count;
        return absl::string_view(pa, count);
      }
      count += 2;
    }
    if (ABSL_PREDICT_TRUE(count != limit)) {
      if (ABSL_PREDICT_TRUE(pa[count] == pb[count])) ++count;
    }
    return absl::string_view(pa, count);
  }

  do {
    uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                         absl::little_endian::Load64(pb + count);
    if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
      count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
      return absl::string_view(pa, count);
    }
    count += 8;
  } while (ABSL_PREDICT_TRUE(count + 8 < limit));

  count = limit - 8;
  uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                       absl::little_endian::Load64(pb + count);
  if (ABSL_PREDICT_TRUE(xor_bytes != 0)) {
    count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
    return absl::string_view(pa, count);
  }
  return absl::string_view(pa, limit);
}